

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bt_peer_connection * __thiscall libtorrent::aux::torrent::find_peer(torrent *this,endpoint *ep)

{
  bt_peer_connection *pbVar1;
  bool bVar2;
  int iVar3;
  vector<peer_connection_*> *this_00;
  reference pppVar4;
  undefined4 extraout_var;
  peer_connection *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<peer_connection_*> *__range2;
  endpoint *ep_local;
  torrent *this_local;
  
  this_00 = &(this->super_torrent_hot_members).m_connections;
  __end2 = ::std::
           vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           ::begin(&this_00->
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  );
  p = (peer_connection *)
      ::std::
      vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
      ::end(&this_00->
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
           );
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<libtorrent::aux::peer_connection_*const_*,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                *)&p);
    if (!bVar2) {
      return (bt_peer_connection *)0x0;
    }
    pppVar4 = __gnu_cxx::
              __normal_iterator<libtorrent::aux::peer_connection_*const_*,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
              ::operator*(&__end2);
    pbVar1 = (bt_peer_connection *)*pppVar4;
    iVar3 = (*(pbVar1->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[4])();
    if ((char)iVar3 == '\0') {
      iVar3 = (*(pbVar1->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x10])
                        ();
      bVar2 = boost::asio::ip::operator==
                        ((basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var,iVar3),ep);
      if (bVar2) {
        return pbVar1;
      }
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::peer_connection_*const_*,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bt_peer_connection* torrent::find_peer(tcp::endpoint const& ep) const
	{
		for (auto* p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			if (p->type() != connection_type::bittorrent) continue;
			if (p->remote() == ep) return static_cast<bt_peer_connection*>(p);
		}
		return nullptr;
	}